

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void shape_lore_append_list(textblock *tb,char **list,wchar_t n)

{
  char *pcVar1;
  ulong uVar2;
  
  if ((L'\0' < n) && (textblock_append(tb," %s",*list), n != L'\x01')) {
    uVar2 = 1;
    do {
      pcVar1 = " and";
      if (uVar2 < (uint)(n + L'\xffffffff')) {
        pcVar1 = ",";
      }
      textblock_append(tb,"%s %s",pcVar1,list[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

static void shape_lore_append_list(textblock *tb,
	const char * const *list, int n)
{
	int i;

	if (n > 0) {
		textblock_append(tb, " %s", list[0]);
	}
	for (i = 1; i < n; ++i) {
		textblock_append(tb, "%s %s", (i < n - 1) ? "," : " and",
			list[i]);
	}
}